

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

bool __thiscall
flow_cutter::
SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
::advance(SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
          *this)

{
  int iVar1;
  runtime_error *this_00;
  long in_RDI;
  PierceNodeScore *in_stack_00001260;
  Config in_stack_00001270;
  undefined1 in_stack_00001417;
  PierceNodeScore *in_stack_00001418;
  BreadthFirstSearch *in_stack_00001420;
  TemporaryData *in_stack_00001428;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *in_stack_00001430;
  MultiCutter *in_stack_00001438;
  undefined1 local_c0 [88];
  undefined1 local_68 [103];
  bool local_1;
  
  iVar1 = *(int *)(in_RDI + 0x50);
  if (iVar1 == 0) {
    memcpy(local_68,(void *)(in_RDI + 0x38),0x24);
    PierceNodeScore::PierceNodeScore(in_stack_00001260,in_stack_00001270);
    local_1 = MultiCutter::
              advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>
                        (in_stack_00001438,in_stack_00001430,in_stack_00001428,
                         (PseudoDepthFirstSearch *)in_stack_00001420,in_stack_00001418,
                         (bool)in_stack_00001417);
  }
  else if (iVar1 == 1) {
    memcpy(local_c0,(void *)(in_RDI + 0x38),0x24);
    PierceNodeScore::PierceNodeScore(in_stack_00001260,in_stack_00001270);
    local_1 = MultiCutter::
              advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
                        (in_stack_00001438,in_stack_00001430,in_stack_00001428,in_stack_00001420,
                         in_stack_00001418,(bool)in_stack_00001417);
  }
  else {
    if (iVar1 == 2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"depth first search is not yet implemented");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool advance()
    {

        switch (config.graph_search_algorithm) {
        case Config::GraphSearchAlgorithm::pseudo_depth_first_search:
            return cutter.advance(
                graph, tmp, PseudoDepthFirstSearch(), PierceNodeScore(config),
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);

        case Config::GraphSearchAlgorithm::breadth_first_search:
            return cutter.advance(
                graph, tmp, BreadthFirstSearch(), PierceNodeScore(config),
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);

        case Config::GraphSearchAlgorithm::depth_first_search:
            throw std::runtime_error("depth first search is not yet implemented");
        default:
            assert(false);
            return false;
        }
    }